

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

ENetPeer *
enet_protocol_handle_connect(ENetHost *host,ENetProtocolHeader *header,ENetProtocol *command)

{
  byte bVar1;
  size_t sVar2;
  ENetPeer *pEVar3;
  ENetChannel *pEVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  enet_uint32 eVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ENetProtocol verifyCommand;
  ENetProtocol local_62;
  
  uVar14 = header[3].peerID;
  uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  if (uVar14 - 0x100 < 0xffffff01) {
    return (ENetPeer *)0x0;
  }
  sVar2 = host->peerCount;
  if (sVar2 != 0) {
    sVar8 = 0;
    do {
      pEVar3 = host->peer_list[sVar8];
      if ((((pEVar3->state != ENET_PEER_STATE_DISCONNECTED) &&
           ((pEVar3->address).host == (host->receivedAddress).host)) &&
          ((pEVar3->address).port == (host->receivedAddress).port)) &&
         (pEVar3->connectID == header[7].peerID)) {
        return (ENetPeer *)0x0;
      }
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
  }
  if (sVar2 == 0) {
    uVar13 = 0;
    uVar9 = 0;
    sVar8 = 0;
  }
  else {
    sVar8 = 0;
    uVar13 = 0;
    do {
      pEVar3 = host->peer_list[sVar8];
      if ((ENET_PEER_STATE_CONNECTING < pEVar3->state) &&
         ((pEVar3->address).host == (host->receivedAddress).host)) {
        if (((pEVar3->address).port == (host->receivedAddress).port) &&
           (pEVar3->connectID == header[7].peerID)) {
          return (ENetPeer *)0x0;
        }
        uVar13 = uVar13 + 1;
      }
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
    uVar9 = (uint)sVar2;
    sVar8 = sVar2;
  }
  if (0xfffffe < uVar9) {
    return (ENetPeer *)0x0;
  }
  host->peerCount = sVar2 + 1;
  pEVar3 = (ENetPeer *)enet_malloc(0x1d8);
  host->peer_list[sVar8] = pEVar3;
  memset(host->peer_list[sVar8],0,0x1d8);
  pEVar3 = host->peer_list[sVar8];
  pEVar3->host = host;
  pEVar3->incomingPeerID = uVar9;
  pEVar3->outgoingSessionID = 0xff;
  pEVar3->incomingSessionID = 0xff;
  pEVar3->data = (void *)0x0;
  enet_list_clear(&pEVar3->acknowledgements);
  enet_list_clear(&pEVar3->sentReliableCommands);
  enet_list_clear(&pEVar3->sentUnreliableCommands);
  enet_list_clear(&pEVar3->outgoingReliableCommands);
  enet_list_clear(&pEVar3->outgoingUnreliableCommands);
  enet_list_clear(&pEVar3->dispatchedCommands);
  enet_peer_reset(pEVar3);
  if (pEVar3 == (ENetPeer *)0x0) {
    return (ENetPeer *)0x0;
  }
  if (host->duplicatePeers <= uVar13) {
    return (ENetPeer *)0x0;
  }
  uVar13 = (ulong)uVar14;
  if (host->channelLimit < (ulong)uVar14) {
    uVar13 = host->channelLimit;
  }
  pEVar4 = (ENetChannel *)enet_malloc(uVar13 * 0x50);
  pEVar3->channels = pEVar4;
  if (pEVar4 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  pEVar3->channelCount = uVar13;
  pEVar3->state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
  pEVar3->connectID = header[7].peerID;
  pEVar3->address = host->receivedAddress;
  uVar14 = *(uint *)&header->sentTime;
  pEVar3->outgoingPeerID =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = *(uint *)&header[3].sentTime;
  pEVar3->incomingBandwidth =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = *(uint *)((long)&header[4].peerID + 2);
  pEVar3->outgoingBandwidth =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = header[5].peerID;
  pEVar3->packetThrottleInterval =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = *(uint *)&header[5].sentTime;
  pEVar3->packetThrottleAcceleration =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = *(uint *)((long)&header[6].peerID + 2);
  pEVar3->packetThrottleDeceleration =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = *(uint *)&header[7].sentTime;
  pEVar3->eventData =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  bVar1 = *(byte *)((long)&header[1].peerID + 2);
  if (bVar1 == 0xff) {
    bVar1 = pEVar3->outgoingSessionID;
  }
  bVar5 = bVar1 + 1 & 3;
  if (bVar5 == pEVar3->outgoingSessionID) {
    bVar5 = bVar1 & 3 ^ 2;
  }
  pEVar3->outgoingSessionID = bVar5;
  bVar1 = *(byte *)((long)&header[1].peerID + 3);
  if (bVar1 == 0xff) {
    bVar1 = pEVar3->incomingSessionID;
  }
  bVar6 = bVar1 + 1 & 3;
  if (bVar6 == pEVar3->incomingSessionID) {
    bVar6 = bVar1 & 3 ^ 2;
  }
  pEVar3->incomingSessionID = bVar6;
  if (pEVar4 < pEVar3->channels + uVar13) {
    do {
      pEVar4->outgoingReliableSequenceNumber = 0;
      pEVar4->outgoingUnreliableSequenceNumber = 0;
      pEVar4->incomingReliableSequenceNumber = 0;
      pEVar4->incomingUnreliableSequenceNumber = 0;
      enet_list_clear(&pEVar4->incomingReliableCommands);
      enet_list_clear(&pEVar4->incomingUnreliableCommands);
      pEVar4->reliableWindows[7] = 0;
      pEVar4->reliableWindows[8] = 0;
      pEVar4->reliableWindows[9] = 0;
      pEVar4->reliableWindows[10] = 0;
      pEVar4->reliableWindows[0xb] = 0;
      pEVar4->reliableWindows[0xc] = 0;
      pEVar4->reliableWindows[0xd] = 0;
      pEVar4->reliableWindows[0xe] = 0;
      pEVar4->usedReliableWindows = 0;
      pEVar4->reliableWindows[0] = 0;
      pEVar4->reliableWindows[1] = 0;
      pEVar4->reliableWindows[2] = 0;
      pEVar4->reliableWindows[3] = 0;
      pEVar4->reliableWindows[4] = 0;
      pEVar4->reliableWindows[5] = 0;
      pEVar4->reliableWindows[6] = 0;
      pEVar4->reliableWindows[0xf] = 0;
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 < pEVar3->channels + uVar13);
  }
  uVar14 = *(uint *)&header[1].sentTime;
  uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  if (0xfff < uVar14) {
    uVar14 = 0x1000;
  }
  uVar9 = 0x240;
  if (0x240 < uVar14) {
    uVar9 = uVar14;
  }
  pEVar3->mtu = uVar9;
  uVar14 = host->outgoingBandwidth;
  if (uVar14 == 0) {
    if (pEVar3->incomingBandwidth != 0) goto LAB_001077f9;
    uVar7 = 0x10000;
  }
  else {
    uVar7 = pEVar3->incomingBandwidth;
    if (uVar7 == 0) {
LAB_001077f9:
      uVar7 = pEVar3->incomingBandwidth;
      if (pEVar3->incomingBandwidth < uVar14) {
        uVar7 = uVar14;
      }
    }
    else if (uVar14 < uVar7) {
      uVar7 = uVar14;
    }
    uVar7 = uVar7 >> 4 & 0xffff000;
  }
  pEVar3->windowSize = uVar7;
  if (uVar7 == 0) {
    eVar10 = 0x1000;
  }
  else {
    eVar10 = 0x10000;
    if (uVar7 < 0x10001) goto LAB_00107837;
  }
  pEVar3->windowSize = eVar10;
LAB_00107837:
  uVar7 = host->incomingBandwidth;
  uVar11 = uVar7 >> 4 & 0xffff000;
  if (uVar7 == 0) {
    uVar11 = 0x10000;
  }
  uVar12 = *(uint *)((long)&header[2].peerID + 2);
  uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  if (uVar11 < uVar12) {
    uVar12 = uVar11;
  }
  if (0xffff < uVar12) {
    uVar12 = 0x10000;
  }
  uVar11 = 0x1000;
  if (0x1000 < uVar12) {
    uVar11 = uVar12;
  }
  local_62._0_2_ = 0xff83;
  uVar12 = pEVar3->incomingPeerID;
  local_62.connect.outgoingPeerID =
       uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  local_62.connect.mtu =
       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  local_62.connect.windowSize =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  local_62.connect.channelCount = (int)uVar13 << 0x18;
  local_62.connect.incomingBandwidth =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  local_62.connect.outgoingBandwidth =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = pEVar3->packetThrottleInterval;
  local_62.connect.packetThrottleInterval =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = pEVar3->packetThrottleAcceleration;
  local_62.connect.packetThrottleAcceleration =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = pEVar3->packetThrottleDeceleration;
  local_62.connect.packetThrottleDeceleration =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  local_62.connect.connectID = pEVar3->connectID;
  local_62.connect.incomingSessionID = bVar5;
  local_62.connect.outgoingSessionID = bVar6;
  enet_peer_queue_outgoing_command(pEVar3,&local_62,(ENetPacket *)0x0,0,0);
  return pEVar3;
}

Assistant:

static ENetPeer *
enet_protocol_handle_connect (ENetHost * host, ENetProtocolHeader * header, ENetProtocol * command)
{
    enet_uint8 incomingSessionID, outgoingSessionID;
    enet_uint32 mtu, windowSize;
    ENetChannel * channel;
    size_t channelCount, duplicatePeers = 0;
    ENetPeer * currentPeer, * peer = NULL;
    ENetProtocol verifyCommand;
    int i;

    channelCount = ENET_NET_TO_HOST_32 (command -> connect.channelCount);

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT ||
        channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      return NULL;

    for (i = 0; i < host -> peerCount; i++ ) 
    {
	currentPeer = host -> peer_list[i];

        if (currentPeer -> state != ENET_PEER_STATE_DISCONNECTED &&
            currentPeer -> address.host == host -> receivedAddress.host &&
            currentPeer -> address.port == host -> receivedAddress.port &&
            currentPeer -> connectID == command -> connect.connectID)
          return NULL;
    }

    for (i = 0; i < host -> peerCount; i++ )
    {
	currentPeer = host -> peer_list[i];

        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
        {
            if (peer == NULL)
              peer = currentPeer;
        }
        else 
        if (currentPeer -> state != ENET_PEER_STATE_CONNECTING &&
            currentPeer -> address.host == host -> receivedAddress.host)
        {
            if (currentPeer -> address.port == host -> receivedAddress.port &&
                currentPeer -> connectID == command -> connect.connectID)
              return NULL;

            ++ duplicatePeers;
        }
    }

    if (i >= host -> peerCount)
    {
	if (i >= ENET_PROTOCOL_MAXIMUM_PEER_ID) 
	    return NULL;
	host -> peerCount++;
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
	peer = host->peer_list[i];
	peer -> host = host;
	peer -> incomingPeerID = i;
	peer -> outgoingSessionID = peer -> incomingSessionID = 0xFF;
	peer -> data = NULL;

	enet_list_clear (& peer -> acknowledgements);
	enet_list_clear (& peer -> sentReliableCommands);
	enet_list_clear (& peer -> sentUnreliableCommands);
	enet_list_clear (& peer -> outgoingReliableCommands);
	enet_list_clear (& peer -> outgoingUnreliableCommands);
	enet_list_clear (& peer -> dispatchedCommands);

	enet_peer_reset (peer);
    }

    if (peer == NULL || duplicatePeers >= host -> duplicatePeers)
      return NULL;

    if (channelCount > host -> channelLimit)
      channelCount = host -> channelLimit;
    peer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (peer -> channels == NULL)
      return NULL;
    peer -> channelCount = channelCount;
    peer -> state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
    peer -> connectID = command -> connect.connectID;
    peer -> address = host -> receivedAddress;
    peer -> outgoingPeerID = ENET_NET_TO_HOST_32 (command -> connect.outgoingPeerID);
    peer -> incomingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.incomingBandwidth);
    peer -> outgoingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.outgoingBandwidth);
    peer -> packetThrottleInterval = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleInterval);
    peer -> packetThrottleAcceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleAcceleration);
    peer -> packetThrottleDeceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleDeceleration);
    peer -> eventData = ENET_NET_TO_HOST_32 (command -> connect.data);

    incomingSessionID = command -> connect.incomingSessionID == 0xFF ? peer -> outgoingSessionID : command -> connect.incomingSessionID;
    incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (incomingSessionID == peer -> outgoingSessionID)
      incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> outgoingSessionID = incomingSessionID;

    outgoingSessionID = command -> connect.outgoingSessionID == 0xFF ? peer -> incomingSessionID : command -> connect.outgoingSessionID;
    outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (outgoingSessionID == peer -> incomingSessionID)
      outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> incomingSessionID = outgoingSessionID;

    for (channel = peer -> channels;
         channel < & peer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }

    mtu = ENET_NET_TO_HOST_32 (command -> connect.mtu);

    if (mtu < ENET_PROTOCOL_MINIMUM_MTU)
      mtu = ENET_PROTOCOL_MINIMUM_MTU;
    else
    if (mtu > ENET_PROTOCOL_MAXIMUM_MTU)
      mtu = ENET_PROTOCOL_MAXIMUM_MTU;

    peer -> mtu = mtu;

    if (host -> outgoingBandwidth == 0 &&
        peer -> incomingBandwidth == 0)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
    if (host -> outgoingBandwidth == 0 ||
        peer -> incomingBandwidth == 0)
      peer -> windowSize = (ENET_MAX (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) *
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
      peer -> windowSize = (ENET_MIN (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (peer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (peer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    if (host -> incomingBandwidth == 0)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      windowSize = (host -> incomingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) *
                     ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (windowSize > ENET_NET_TO_HOST_32 (command -> connect.windowSize))
      windowSize = ENET_NET_TO_HOST_32 (command -> connect.windowSize);

    if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    verifyCommand.header.command = ENET_PROTOCOL_COMMAND_VERIFY_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    verifyCommand.header.channelID = 0xFF;
    verifyCommand.verifyConnect.outgoingPeerID = ENET_HOST_TO_NET_32 (peer -> incomingPeerID);
    verifyCommand.verifyConnect.incomingSessionID = incomingSessionID;
    verifyCommand.verifyConnect.outgoingSessionID = outgoingSessionID;
    verifyCommand.verifyConnect.mtu = ENET_HOST_TO_NET_32 (peer -> mtu);
    verifyCommand.verifyConnect.windowSize = ENET_HOST_TO_NET_32 (windowSize);
    verifyCommand.verifyConnect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    verifyCommand.verifyConnect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    verifyCommand.verifyConnect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    verifyCommand.verifyConnect.packetThrottleInterval = ENET_HOST_TO_NET_32 (peer -> packetThrottleInterval);
    verifyCommand.verifyConnect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleAcceleration);
    verifyCommand.verifyConnect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleDeceleration);
    verifyCommand.verifyConnect.connectID = peer -> connectID;

    enet_peer_queue_outgoing_command (peer, & verifyCommand, NULL, 0, 0);

    return peer;
}